

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::step_push
          (xpath_ast_node *this,xpath_node_set_raw *ns,xml_attribute *a,xml_node *parent,
          xpath_allocator *alloc)

{
  bool bVar1;
  undefined1 uVar2;
  long lVar3;
  xml_node_struct *src;
  undefined1 in_R9B;
  char cVar4;
  undefined7 in_register_00000089;
  xpath_node local_30;
  
  local_30._attribute._attr = (xml_attribute_struct *)parent->_root;
  if ((xpath_memory_block *)local_30._attribute._attr != (xpath_memory_block *)0x0) {
    src = (xml_node_struct *)0x125431;
    if (*(xml_node_struct **)((xpath_memory_block *)local_30._attribute._attr)->data !=
        (xml_node_struct *)0x0) {
      src = *(xml_node_struct **)((xpath_memory_block *)local_30._attribute._attr)->data;
    }
    cVar4 = 'x';
    lVar3 = 0;
    do {
      if (*(char *)((long)&src->header + lVar3) != cVar4) goto LAB_00123056;
      cVar4 = "xmlns"[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 5);
    cVar4 = *(char *)((long)&src->header + 5);
    if ((cVar4 != '\0') && (cVar4 != ':')) {
LAB_00123056:
      switch((uint)this & 0xff) {
      case 1:
        bVar1 = strequal((char_t *)src,(char_t *)ns);
        if (!bVar1) {
          return;
        }
        local_30._attribute._attr = (xml_attribute_struct *)parent->_root;
        local_30._node._root = (xml_node_struct *)local_30._attribute._attr;
        if ((xpath_memory_block *)local_30._attribute._attr != (xpath_memory_block *)0x0) {
          local_30._node._root = (xml_node_struct *)alloc->_root;
        }
        break;
      default:
        goto switchD_0012306e_caseD_3;
      case 8:
        uVar2 = (undefined1)ns->_type;
        if (uVar2 != type_unsorted) {
          lVar3 = 0;
          do {
            if (*(char *)((long)&src->header + lVar3) != uVar2) {
              return;
            }
            uVar2 = *(char *)((long)&ns->_type + lVar3 + 1);
            lVar3 = lVar3 + 1;
          } while (uVar2 != type_unsorted);
        }
      case 2:
      case 7:
        local_30._node._root = (xml_node_struct *)alloc->_root;
      }
      xpath_node_set_raw::push_back
                ((xpath_node_set_raw *)a,&local_30,
                 (xpath_allocator *)CONCAT71(in_register_00000089,in_R9B));
    }
  }
switchD_0012306e_caseD_3:
  return;
}

Assistant:

void step_push(xpath_node_set_raw& ns, const xml_attribute& a, const xml_node& parent, xpath_allocator* alloc)
		{
			if (!a) return;

			const char_t* name = a.name();

			// There are no attribute nodes corresponding to attributes that declare namespaces
			// That is, "xmlns:..." or "xmlns"
			if (starts_with(name, PUGIXML_TEXT("xmlns")) && (name[5] == 0 || name[5] == ':')) return;
			
			switch (_test)
			{
			case nodetest_name:
				if (strequal(name, _data.nodetest)) ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_type_node:
			case nodetest_all:
				ns.push_back(xpath_node(a, parent), alloc);
				break;
				
			case nodetest_all_in_namespace:
				if (starts_with(name, _data.nodetest))
					ns.push_back(xpath_node(a, parent), alloc);
				break;
			
			default:
				;
			}
		}